

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChDistribution.cpp
# Opt level: O2

double __thiscall chrono::ChDiscreteDistribution::GetRandom(ChDiscreteDistribution *this)

{
  Scalar *pSVar1;
  int i;
  long index;
  double dVar2;
  Scalar SVar3;
  
  dVar2 = ChRandom();
  SVar3 = 0.0;
  index = 0;
  while( true ) {
    if ((this->x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <=
        index) {
      return 0.0;
    }
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&this->cdf_y,
                        index);
    if ((dVar2 <= *pSVar1) && (SVar3 < dVar2)) break;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&this->cdf_y,
                        index);
    SVar3 = *pSVar1;
    index = index + 1;
  }
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&this->x,index);
  return *pSVar1;
}

Assistant:

double ChDiscreteDistribution::GetRandom() {
    double rand = ChRandom();
    double lastval = 0;
    for (int i = 0; i < x.size(); i++) {
        if ((rand <= cdf_y(i)) && (rand > lastval)) {
            return x(i);
        }
        lastval = cdf_y(i);
    }
    return 0;
}